

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::delaunizesegments(tetgenmesh *this)

{
  tetrahedron *pppdVar1;
  arraypool *paVar2;
  double *pdVar3;
  shellface ppdVar4;
  ulong uVar5;
  shellface ppdVar6;
  shellface *pppdVar7;
  shellface *pppdVar8;
  shellface *pppdVar9;
  ulong uVar10;
  ulong uVar11;
  tetrahedron *pppdVar12;
  point insertpt;
  int i;
  interresult iVar13;
  int iVar14;
  tetrahedron ppdVar15;
  undefined4 *puVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  tetrahedron *pppdVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  face sseg;
  triface searchtet;
  point newpt;
  point refpt;
  face searchsh;
  insertvertexflags ivf;
  arraypool *in_stack_fffffffffffffef8;
  face local_f0;
  triface local_e0;
  long local_d0;
  point local_c8;
  point local_c0;
  face local_b8;
  insertvertexflags local_a8;
  
  local_b8.sh = (shellface *)0x0;
  local_b8.shver = 0;
  local_a8.refinetet.tet = (tetrahedron *)0x0;
  local_a8.refinetet.ver = 0;
  local_a8.refinesh.sh = (shellface *)0x0;
  local_a8.refinesh.shver = 0;
  local_a8.smlen = 0.0;
  local_a8.lawson = 0;
  local_a8.splitbdflag = 0;
  local_a8.validflag = 0;
  local_a8.respectbdflag = 0;
  local_a8.rejflag = 0;
  local_a8.chkencflag = 0;
  local_a8.refineflag = 0;
  local_a8.iloc = 0;
  local_a8.bowywat = 1;
  local_a8.sloc = 4;
  local_a8.sbowywat = 1;
  local_a8._32_8_ = (ulong)(uint)this->b->metric << 0x20;
  local_a8.smlenflag = this->useinsertradius;
  paVar2 = this->subsegstack;
  lVar18 = paVar2->objects;
  do {
    if (lVar18 < 1) {
      return;
    }
    uVar17 = lVar18 - 1;
    paVar2->objects = uVar17;
    lVar18 = (long)paVar2->objectbytes * ((long)paVar2->objectsperblockmark & uVar17);
    local_f0.sh = *(shellface **)
                   (paVar2->toparray[(long)uVar17 >> ((byte)paVar2->log2objectsperblock & 0x3f)] +
                   lVar18);
    local_f0.shver =
         *(int *)(paVar2->toparray[(long)uVar17 >> ((byte)paVar2->log2objectsperblock & 0x3f)] +
                 lVar18 + 8);
    local_e0.ver = (uint)local_f0.sh[9] & 0xf;
    local_e0.tet = (tetrahedron *)((ulong)local_f0.sh[9] & 0xfffffffffffffff0);
    if (local_e0.tet == (tetrahedron *)0x0) {
      iVar13 = scoutsegment(this,(point)local_f0.sh[sorgpivot[local_f0.shver]],
                            (point)local_f0.sh[sdestpivot[local_f0.shver]],&local_f0,&local_e0,
                            &local_c0,in_stack_fffffffffffffef8);
      pppdVar12 = local_e0.tet;
      if (iVar13 == SHAREEDGE) {
        uVar17 = (ulong)local_e0.ver;
        local_f0.sh[9] = (shellface)(uVar17 | (ulong)local_e0.tet);
        pppdVar20 = local_e0.tet;
        do {
          if (pppdVar20[8] == (tetrahedron)0x0) {
            ppdVar15 = (tetrahedron)memorypool::alloc(this->tet2segpool);
            pppdVar20[8] = ppdVar15;
            lVar18 = 0;
            do {
              pppdVar20[8][lVar18] = (double *)0x0;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
          }
          iVar14 = (int)uVar17;
          pppdVar20[8][ver2edge[iVar14]] = (double *)((long)local_f0.shver | (ulong)local_f0.sh);
          pppdVar1 = pppdVar20 + facepivot1[iVar14];
          pppdVar20 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
          uVar17 = (ulong)(uint)facepivot2[iVar14][(uint)*pppdVar1 & 0xf];
        } while (pppdVar12 != pppdVar20);
      }
      else {
        if ((iVar13 & ~INTERSECT) != ACROSSEDGE) {
LAB_001335e0:
          puVar16 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar16 = 2;
          goto LAB_001335f0;
        }
        makepoint(this,&local_c8,FREESEGVERTEX);
        insertpt = local_c8;
        getsteinerptonsegment(this,&local_f0,local_c0,local_c8);
        local_a8.iloc = 1;
        iVar14 = insertpoint(this,insertpt,&local_e0,&local_b8,&local_f0,&local_a8);
        if (iVar14 == 0) {
          if (local_a8.iloc != 5) {
            if ((local_a8.iloc != 9) ||
               ((*(uint *)((long)local_e0.tet[orgpivot[local_e0.ver]] +
                          (long)this->pointmarkindex * 4 + 4) & 0xffffff00) != 0x600))
            goto LAB_001335e0;
            pdVar3 = local_e0.tet[orgpivot[local_e0.ver]][(long)this->point2simindex + 2];
            uVar17 = (ulong)((uint)pdVar3 & 7);
            lVar21 = (long)local_f0.shver;
            ppdVar4 = local_f0.sh[snextpivot[snextpivot[lVar21]] >> 1];
            lVar18 = lVar21;
            pppdVar8 = local_f0.sh;
            while (pppdVar7 = (shellface *)((ulong)ppdVar4 & 0xfffffffffffffff8),
                  pppdVar7 != (shellface *)0x0) {
              uVar22 = (uint)ppdVar4 & 7;
              lVar18 = (long)snextpivot
                             [snextpivot
                              [pppdVar7[sorgpivot[uVar22]] != pppdVar8[sorgpivot[lVar18]] ^ uVar22]]
              ;
              pppdVar8 = pppdVar7;
              ppdVar4 = pppdVar7[snextpivot[snextpivot[lVar18]] >> 1];
            }
            uVar23 = (ulong)pdVar3 & 0xfffffffffffffff8;
            ppdVar4 = local_f0.sh[snextpivot[lVar21] >> 1];
            pppdVar7 = local_f0.sh;
            while (pppdVar9 = (shellface *)((ulong)ppdVar4 & 0xfffffffffffffff8),
                  pppdVar9 != (shellface *)0x0) {
              uVar22 = (uint)ppdVar4 & 7;
              lVar21 = (long)snextpivot
                             [pppdVar9[sdestpivot[uVar22]] != pppdVar7[sdestpivot[lVar21]] ^ uVar22]
              ;
              pppdVar7 = pppdVar9;
              ppdVar4 = pppdVar9[snextpivot[lVar21] >> 1];
            }
            local_d0 = (long)sorgpivot[lVar18];
            uVar5 = *(ulong *)(uVar23 + (long)(snextpivot[snextpivot[uVar17]] >> 1) * 8);
            uVar10 = uVar23;
            uVar19 = uVar17;
            while (uVar11 = uVar5 & 0xfffffffffffffff8, uVar11 != 0) {
              uVar22 = (uint)uVar5 & 7;
              uVar19 = (ulong)snextpivot
                              [snextpivot
                               [*(long *)(uVar11 + (long)sorgpivot[uVar22] * 8) !=
                                *(long *)(uVar10 + (long)sorgpivot[uVar19] * 8) ^ uVar22]];
              uVar10 = uVar11;
              uVar5 = *(ulong *)(uVar11 + (long)(snextpivot[snextpivot[uVar19]] >> 1) * 8);
            }
            ppdVar4 = pppdVar8[local_d0];
            ppdVar6 = pppdVar7[sdestpivot[lVar21]];
            lVar18 = *(long *)(uVar10 + (long)sorgpivot[uVar19] * 8);
            uVar5 = *(ulong *)(uVar23 + (long)(snextpivot[uVar17] >> 1) * 8);
            uVar10 = uVar23;
            while (uVar19 = uVar5 & 0xfffffffffffffff8, uVar19 != 0) {
              uVar22 = (uint)uVar5 & 7;
              uVar17 = (ulong)snextpivot
                              [*(long *)(uVar19 + (long)sdestpivot[uVar22] * 8) !=
                               *(long *)(uVar10 + (long)sdestpivot[uVar17] * 8) ^ uVar22];
              uVar10 = uVar19;
              uVar5 = *(ulong *)(uVar19 + (long)(snextpivot[uVar17] >> 1) * 8);
            }
            lVar21 = *(long *)(uVar10 + (long)sdestpivot[uVar17] * 8);
            puts("Two segments are very close to each other.");
            printf("  Segment 1: [%d, %d] #%d\n",
                   (ulong)*(uint *)((long)ppdVar4 + (long)this->pointmarkindex * 4),
                   (ulong)*(uint *)((long)ppdVar6 + (long)this->pointmarkindex * 4),
                   (ulong)*(uint *)((long)local_f0.sh + (long)this->shmarkindex * 4));
            printf("  Segment 2: [%d, %d] #%d\n",
                   (ulong)*(uint *)(lVar18 + (long)this->pointmarkindex * 4),
                   (ulong)*(uint *)(lVar21 + (long)this->pointmarkindex * 4),
                   (ulong)*(uint *)(uVar23 + (long)this->shmarkindex * 4));
            puVar16 = (undefined4 *)__cxa_allocate_exception(4);
            *puVar16 = 4;
LAB_001335f0:
            __cxa_throw(puVar16,&int::typeinfo,0);
          }
          local_e0.ver = eprevtbl[local_e0.ver];
          report_selfint_edge(this,(point)local_f0.sh[sorgpivot[local_f0.shver]],
                              (point)local_f0.sh[sdestpivot[local_f0.shver]],&local_f0,&local_e0,
                              ACROSSVERT);
        }
        else {
          this->st_segref_count = this->st_segref_count + 1;
          if (0 < this->steinerleft) {
            this->steinerleft = this->steinerleft + -1;
          }
          if (this->useinsertradius != 0) {
            save_segmentpoint_insradius(this,insertpt,local_a8.parentpt,local_a8.smlen);
          }
        }
      }
    }
    paVar2 = this->subsegstack;
    lVar18 = paVar2->objects;
  } while( true );
}

Assistant:

void tetgenmesh::delaunizesegments()
{
  triface searchtet, spintet;
  face searchsh;
  face sseg, *psseg;
  point refpt, newpt;
  enum interresult dir;
  insertvertexflags ivf;
  int t1ver; 


  ivf.bowywat = 1; // Use Bowyer-Watson insertion.
  ivf.sloc = (int) ONEDGE; // on 'sseg'.
  ivf.sbowywat = 1; // Use Bowyer-Watson insertion.
  ivf.assignmeshsize = b->metric;
  ivf.smlenflag = useinsertradius; // Return the closet mesh vertex.

  // Loop until 'subsegstack' is empty.
  while (subsegstack->objects > 0l) {
    // seglist is used as a stack.
    subsegstack->objects--;
    psseg = (face *) fastlookup(subsegstack, subsegstack->objects);
    sseg = *psseg;

    // Check if this segment has been recovered.
    sstpivot1(sseg, searchtet);
    if (searchtet.tet != NULL) {
      continue; // Not a missing segment.
    }

    // Search the segment.
    dir = scoutsegment(sorg(sseg), sdest(sseg), &sseg,&searchtet,&refpt,NULL);

    if (dir == SHAREEDGE) {
      // Found this segment, insert it.
      // Let the segment remember an adjacent tet.
      sstbond1(sseg, searchtet);
      // Bond the segment to all tets containing it.
      spintet = searchtet;
      do {
        tssbond1(spintet, sseg);
        fnextself(spintet);
      } while (spintet.tet != searchtet.tet);
    } else {
      if ((dir == ACROSSFACE) || (dir == ACROSSEDGE)) {
        // The segment is missing. Split it.
        // Create a new point.
        makepoint(&newpt, FREESEGVERTEX);
        //setpointtype(newpt, FREESEGVERTEX);
        getsteinerptonsegment(&sseg, refpt, newpt);

        // Start searching from 'searchtet'.
        ivf.iloc = (int) OUTSIDE;
        // Insert the new point into the tetrahedralization T.
        //   Missing segments and subfaces are queued for recovery.
        //   Note that T is convex (nonconvex = 0).
        if (insertpoint(newpt, &searchtet, &searchsh, &sseg, &ivf)) {
          // The new point has been inserted.
          st_segref_count++;
          if (steinerleft > 0) steinerleft--;
          if (useinsertradius) {
            save_segmentpoint_insradius(newpt, ivf.parentpt, ivf.smlen);
          } 
        } else {
          if (ivf.iloc == (int) NEARVERTEX) {
            // The new point (in the segment) is very close to an existing 
            //   vertex -- a small feature is detected.
            point nearpt = org(searchtet);
            if (pointtype(nearpt) == FREESEGVERTEX) {
              face parentseg;
              sdecode(point2sh(nearpt), parentseg);
              point p1 = farsorg(sseg);
              point p2 = farsdest(sseg);
              point p3 = farsorg(parentseg);
              point p4 = farsdest(parentseg);
              printf("Two segments are very close to each other.\n");
              printf("  Segment 1: [%d, %d] #%d\n", pointmark(p1),
                     pointmark(p2), shellmark(sseg));
              printf("  Segment 2: [%d, %d] #%d\n", pointmark(p3),
                     pointmark(p4), shellmark(parentseg));
              terminatetetgen(this, 4);
            } else {
              terminatetetgen(this, 2);
            }
          } else if (ivf.iloc == (int) ONVERTEX) {
            // The new point (in the segment) is coincident with an existing 
            //   vertex -- a self-intersection is detected.
            eprevself(searchtet);
            report_selfint_edge(sorg(sseg), sdest(sseg), &sseg, &searchtet,
                                ACROSSVERT);
          } else {
            // An unknown case. Report a bug.
            terminatetetgen(this, 2);
          }
        }
      } else {
        // An unknown case. Report a bug.
        terminatetetgen(this, 2);
      }
    }
  } // while
}